

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffpdfl(fitsfile *fptr,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  size_t __n;
  LONGLONG bytepos;
  int tstatus;
  char fill [2880];
  
  iVar1 = *status;
  if (0 < iVar1) {
    return iVar1;
  }
  pFVar2 = fptr->Fptr;
  if (fptr->HDUposition != pFVar2->curhdu) {
    return iVar1;
  }
  if (pFVar2->heapstart == 0) {
    return iVar1;
  }
  bytepos = pFVar2->heapstart + pFVar2->datastart + pFVar2->heapsize;
  lVar4 = (bytepos + 0xb3f) % 0xb40;
  if (lVar4 < 0) {
    *status = 0x108;
    return 0x108;
  }
  bVar5 = (pFVar2->hdutype == 1) << 5;
  tstatus = 0;
  if (lVar4 == 0xb3f) {
    bytepos = bytepos + -1;
    ffmbyt(fptr,bytepos,0,&tstatus);
    __n = 1;
    ffgbyt(fptr,1,fill,&tstatus);
    if (tstatus == 0) goto LAB_0013d14d;
  }
  else {
    __n = 0xb3f - lVar4;
    ffmbyt(fptr,bytepos,0,&tstatus);
    ffgbyt(fptr,__n,fill,&tstatus);
    if (tstatus == 0) {
      for (uVar3 = 0; (__n & 0xffffffff) != uVar3; uVar3 = uVar3 + 1) {
        if (fill[uVar3] != bVar5) goto LAB_0013d100;
      }
      uVar3 = __n & 0xffffffff;
LAB_0013d100:
      if ((int)uVar3 == (int)__n) goto LAB_0013d14d;
    }
  }
  memset(fill,(uint)bVar5,__n);
  ffmbyt(fptr,bytepos,1,status);
  ffpbyt(fptr,__n,fill,status);
  if (*status < 1) {
    return *status;
  }
  ffpmsg("Error writing Data Unit fill bytes (ffpdfl).");
LAB_0013d14d:
  return *status;
}

Assistant:

int ffpdfl(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Write the Data Unit Fill values if they are not already correct.
  The fill values are used to fill out the last 2880 byte block of the HDU.
  Fill the data unit with zeros or blanks depending on the type of HDU
  from the end of the data to the end of the current FITS 2880 byte block
*/
{
    char chfill, fill[2880];
    LONGLONG fillstart;
    int nfill, tstatus, ii;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        return(*status);      /* fill has already been correctly written */

    if ((fptr->Fptr)->heapstart == 0)
        return(*status);      /* null data unit, so there is no fill */

    fillstart = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart +
                (fptr->Fptr)->heapsize;

    nfill = (long) ((fillstart + 2879) / 2880 * 2880 - fillstart);
    if (nfill >= 2880) /* can only happen if fillstart was negative */
    {
        *status = BAD_HEAP_PTR;
        return (*status);
    }
    
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
        chfill = 32;         /* ASCII tables are filled with spaces */
    else
        chfill = 0;          /* all other extensions are filled with zeros */

    tstatus = 0;

    if (!nfill)  /* no fill bytes; just check that entire table exists */
    {
        fillstart--;
        nfill = 1;
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to last byte */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the last byte */

        if (tstatus == 0)
            return(*status);  /* no EOF error, so everything is OK */
    }
    else
    {
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to fill area */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the fill bytes */

        if (tstatus == 0)
        {
            for (ii = 0; ii < nfill; ii++)
            {
                if (fill[ii] != chfill)
                    break;
            }

            if (ii == nfill)
                return(*status);   /* all the fill values were correct */
        }
    }

    /* fill values are incorrect or have not been written, so write them */

    memset(fill, chfill, nfill);  /* fill the buffer with the fill value */

    ffmbyt(fptr, fillstart, IGNORE_EOF, status); /* move to fill area */
    ffpbyt(fptr, nfill, fill, status); /* write the fill bytes */

    if (*status > 0)
        ffpmsg("Error writing Data Unit fill bytes (ffpdfl).");

    return(*status);
}